

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall higan::EventLoop::CallPendingFunc(EventLoop *this)

{
  bool bVar1;
  reference this_00;
  MutexLockGuard local_68;
  MutexLockGuard guard;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  pending;
  EventLoop *this_local;
  
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&guard);
  MutexLockGuard::MutexLockGuard(&local_68,&this->mutex_);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::swap((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          *)&guard,&this->pending_func_queue_);
  MutexLockGuard::~MutexLockGuard(&local_68);
  while( true ) {
    bVar1 = std::
            queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            ::empty((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                     *)&guard);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = std::
              queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
              ::front((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                       *)&guard);
    std::function<void_()>::operator()(this_00);
    std::
    queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::pop((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
           *)&guard);
  }
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::~queue((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            *)&guard);
  return;
}

Assistant:

void EventLoop::CallPendingFunc()
{
	std::queue<EventLoopFunc> pending;

	{
		/**
		 * muduo这里太妙了 swap之后 立刻释放锁 对CallPendingFunc和RunInLoop影响都很小
		 * 如果不进行拷贝 而是加锁后直接处理pending_func_queue_会对RunInLoop产生较大影响
		 */
		MutexLockGuard guard(mutex_);
		pending.swap(pending_func_queue_);
	}

	while (!pending.empty())
	{
		pending.front()();
		pending.pop();
	}
}